

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int flags)

{
  bool bVar1;
  BYTE *pBVar2;
  uint uVar3;
  HUF_repeat HVar4;
  uint maxNbBits;
  uint *puVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  BYTE *pBVar9;
  long lVar10;
  size_t _var_err__;
  BYTE *op;
  uint *puVar11;
  uint *workSpace_00;
  HUF_CElt *table;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  HUF_CElt *CTable;
  uint maxSymbolValue_local;
  BYTE *local_68;
  BYTE *local_60;
  uint *local_58;
  BYTE *local_50;
  uint local_44;
  ulong local_40;
  uint maxSymbolValueEnd;
  uint maxSymbolValueBegin;
  
  maxSymbolValue_local = maxSymbolValue;
  local_68 = (BYTE *)dst;
  local_60 = (BYTE *)src;
  puVar5 = (uint *)HUF_alignUpWorkspace(workSpace,&wkspSize,8);
  pBVar2 = local_60;
  if (wkspSize < 0x1f08) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
    maxSymbolValue = 0xff;
  }
  pBVar9 = local_68 + dstSize;
  uVar3 = 0xb;
  if (huffLog != 0) {
    uVar3 = huffLog;
  }
  bVar13 = (flags & 4U) != 0;
  bVar14 = repeat != (HUF_repeat *)0x0;
  if ((bVar14 && bVar13) && (op = local_68, CTable = oldHufTable, *repeat == HUF_repeat_valid))
  goto LAB_00141b94;
  puVar11 = puVar5;
  local_50 = pBVar9;
  local_44 = uVar3;
  if (0x9fff < srcSize && (flags & 8U) != 0) {
    local_58 = puVar5;
    maxSymbolValueBegin = maxSymbolValue;
    uVar3 = HIST_count_simple(puVar5,&maxSymbolValueBegin,local_60,0x1000);
    local_40 = (ulong)uVar3;
    maxSymbolValueEnd = maxSymbolValue;
    uVar3 = HIST_count_simple(puVar5,&maxSymbolValueEnd,pBVar2 + (srcSize - 0x1000),0x1000);
    puVar11 = local_58;
    if (uVar3 + local_40 < 0x45) {
      return 0;
    }
  }
  workSpace_00 = puVar11 + 0x302;
  local_58 = puVar5;
  sVar6 = HIST_count_wksp(puVar5,&maxSymbolValue_local,local_60,srcSize,workSpace_00,0x1000);
  puVar5 = local_58;
  uVar3 = maxSymbolValue_local;
  if (0xffffffffffffff88 < sVar6) {
    return sVar6;
  }
  if (sVar6 == srcSize) {
    *local_68 = *local_60;
    return 1;
  }
  if (sVar6 <= (srcSize >> 7) + 4) {
    return 0;
  }
  if (repeat != (HUF_repeat *)0x0) {
    HVar4 = *repeat;
    if (HVar4 == HUF_repeat_check) {
      HVar4 = HUF_repeat_check;
      if (-1 < (int)maxSymbolValue_local) {
        lVar10 = 0;
        bVar1 = false;
        do {
          bVar1 = (bool)(bVar1 | ((char)oldHufTable[lVar10 + 1] == '\0' && local_58[lVar10] != 0));
          lVar10 = lVar10 + 1;
        } while ((ulong)maxSymbolValue_local + 1 != lVar10);
        if (bVar1) {
          *repeat = HUF_repeat_none;
          goto LAB_00141d22;
        }
      }
    }
    pBVar9 = local_50;
    op = local_68;
    CTable = oldHufTable;
    if ((bVar14 && bVar13) && HVar4 != HUF_repeat_none) goto LAB_00141b94;
  }
LAB_00141d22:
  uVar12 = (ulong)maxSymbolValue_local;
  table = (HUF_CElt *)(puVar11 + 0x100);
  maxNbBits = HUF_optimalTableLog(local_44,srcSize,maxSymbolValue_local,workSpace_00,0x1300,table,
                                  local_58,flags);
  sVar6 = HUF_buildCTable_wksp(table,puVar5,uVar3,maxNbBits,workSpace_00,0x1300);
  if (0xffffffffffffff88 < sVar6) {
    return sVar6;
  }
  memset(table + (uVar3 + 2),0,(ulong)(uVar3 + 2) * -8 + 0x808);
  sVar6 = HUF_writeCTable_wksp(local_68,dstSize,table,uVar3,(uint)sVar6,workSpace_00,0x2ec);
  if (0xffffffffffffff88 < sVar6) {
    return sVar6;
  }
  pBVar9 = local_50;
  if (repeat == (HUF_repeat *)0x0) {
    if (srcSize <= sVar6 + 0xc) {
      return 0;
    }
  }
  else {
    if (*repeat == HUF_repeat_none) {
      if (srcSize <= sVar6 + 0xc) {
        return 0;
      }
    }
    else {
      op = local_68;
      CTable = oldHufTable;
      if ((int)uVar3 < 0) goto LAB_00141b94;
      lVar10 = 0;
      uVar7 = 0;
      do {
        uVar7 = uVar7 + (ulong)local_58[lVar10] * (ulong)(byte)oldHufTable[lVar10 + 1];
        lVar10 = lVar10 + 1;
      } while (uVar12 + 1 != lVar10);
      lVar10 = 0;
      uVar8 = 0;
      do {
        uVar8 = uVar8 + (ulong)local_58[lVar10] * (ulong)(byte)local_58[lVar10 * 2 + 0x102];
        lVar10 = lVar10 + 1;
      } while (uVar12 + 1 != lVar10);
      if ((srcSize <= sVar6 + 0xc) || (uVar7 >> 3 <= (uVar8 >> 3) + sVar6)) goto LAB_00141b94;
    }
    *repeat = HUF_repeat_none;
  }
  op = local_68 + sVar6;
  CTable = table;
  if (oldHufTable != (HUF_CElt *)0x0) {
    memcpy(oldHufTable,table,0x808);
    pBVar9 = local_50;
  }
LAB_00141b94:
  sVar6 = HUF_compressCTable_internal(local_68,op,pBVar9,local_60,srcSize,nbStreams,CTable,flags);
  return sVar6;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int flags)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(size_t));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    DEBUGLOG(5, "HUF_compress_internal (srcSize=%zu)", srcSize);
    HUF_STATIC_ASSERT(sizeof(*table) + HUF_WORKSPACE_MAX_ALIGNMENT <= HUF_WORKSPACE_SIZE);

    /* checks & inits */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* If uncompressible data is suspected, do a smaller sampling first */
    DEBUG_STATIC_ASSERT(SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO >= 2);
    if ((flags & HUF_flags_suspectUncompressible) && srcSize >= (SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE * SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO)) {
        size_t largestTotal = 0;
        DEBUGLOG(5, "input suspected incompressible : sampling to check");
        {   unsigned maxSymbolValueBegin = maxSymbolValue;
            CHECK_V_F(largestBegin, HIST_count_simple (table->count, &maxSymbolValueBegin, (const BYTE*)src, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestBegin;
        }
        {   unsigned maxSymbolValueEnd = maxSymbolValue;
            CHECK_V_F(largestEnd, HIST_count_simple (table->count, &maxSymbolValueEnd, (const BYTE*)src + srcSize - SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestEnd;
        }
        if (largestTotal <= ((2 * SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->wksps.hist_wksp, sizeof(table->wksps.hist_wksp)) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }
    DEBUGLOG(6, "histogram detail completed (%zu symbols)", showU32(table->count, maxSymbolValue+1));

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue, &table->wksps, sizeof(table->wksps), table->CTable, table->count, flags);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        DEBUGLOG(6, "bit distribution completed (%zu symbols)", showCTableBits(table->CTable + 1, maxSymbolValue+1));
    }
    /* Zero unused symbols in CTable, so we can check it for validity */
    {
        size_t const ctableSize = HUF_CTABLE_SIZE_ST(maxSymbolValue);
        size_t const unusedSize = sizeof(table->CTable) - ctableSize * sizeof(HUF_CElt);
        ZSTD_memset(table->CTable + ctableSize, 0, unusedSize);
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, flags);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, flags);
}